

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

void __thiscall kj::_::Debug::Context::onFatalException(Context *this,Exception *exception)

{
  ExceptionCallback *pEVar1;
  char *pcVar2;
  size_t sVar3;
  Value v;
  Value local_40;
  
  ensureInitialized(&local_40,this);
  Exception::wrapContext(exception,local_40.file,local_40.line,&local_40.description);
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[3])(pEVar1,exception);
  sVar3 = local_40.description.content.size_;
  pcVar2 = local_40.description.content.ptr;
  if (local_40.description.content.ptr != (char *)0x0) {
    local_40.description.content.ptr = (char *)0x0;
    local_40.description.content.size_ = 0;
    (**(local_40.description.content.disposer)->_vptr_ArrayDisposer)
              (local_40.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void Debug::Context::onFatalException(Exception&& exception) {
  Value v = ensureInitialized();
  exception.wrapContext(v.file, v.line, mv(v.description));
  next.onFatalException(kj::mv(exception));
}